

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::ProcessSetGlobalSettings
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pointer pbVar1;
  bool bVar2;
  Value *pVVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  Value local_2f0;
  anon_class_8_1_3fcf6528 local_2c8;
  function<void_(bool)> local_2c0;
  anon_class_8_1_3fcf6528 local_2a0;
  function<void_(bool)> local_298;
  anon_class_8_1_3fcf6528 local_278;
  function<void_(bool)> local_270;
  anon_class_8_1_3fcf6528 local_250;
  function<void_(bool)> local_248;
  anon_class_8_1_3fcf6528 local_228;
  function<void_(bool)> local_220;
  anon_class_8_1_3fcf6528 local_200;
  function<void_(bool)> local_1f8;
  anon_class_8_1_3fcf6528 local_1d8;
  function<void_(bool)> local_1d0;
  cmake *local_1b0;
  cmake *cm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  reference local_160;
  string *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  boolValues;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  local_130 = &local_128;
  boolValues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &request->Type;
  std::__cxx11::string::string((string *)local_130,(string *)&kDEBUG_OUTPUT_KEY_abi_cxx11_);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
  std::__cxx11::string::string((string *)local_130,(string *)&kTRACE_KEY_abi_cxx11_);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  std::__cxx11::string::string((string *)local_130,(string *)&kTRACE_EXPAND_KEY_abi_cxx11_);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  std::__cxx11::string::string((string *)local_130,(string *)&kWARN_UNINITIALIZED_KEY_abi_cxx11_);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  std::__cxx11::string::string((string *)local_130,(string *)&kWARN_UNUSED_KEY_abi_cxx11_);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  std::__cxx11::string::string((string *)local_130,(string *)&kWARN_UNUSED_CLI_KEY_abi_cxx11_);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
  std::__cxx11::string::string((string *)local_130,(string *)&kCHECK_SYSTEM_VARS_KEY_abi_cxx11_);
  local_48 = &local_128;
  local_40 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1 + 3));
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1 + 3));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1 + 3));
  local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  do {
    local_318 = local_318 + -1;
    std::__cxx11::string::~string((string *)local_318);
  } while (local_318 != &local_128);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
  i = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar2) {
      local_1d8.cm = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b0 = local_1d8.cm;
      std::function<void(bool)>::
      function<cmServerProtocol1::ProcessSetGlobalSettings(cmServerRequest_const&)::__0,void>
                ((function<void(bool)> *)&local_1d0,&local_1d8);
      setBool((cmServerRequest *)pbVar1,&kDEBUG_OUTPUT_KEY_abi_cxx11_,&local_1d0);
      std::function<void_(bool)>::~function(&local_1d0);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_200.cm = local_1b0;
      std::function<void(bool)>::
      function<cmServerProtocol1::ProcessSetGlobalSettings(cmServerRequest_const&)::__1,void>
                ((function<void(bool)> *)&local_1f8,&local_200);
      setBool((cmServerRequest *)pbVar1,&kTRACE_KEY_abi_cxx11_,&local_1f8);
      std::function<void_(bool)>::~function(&local_1f8);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_228.cm = local_1b0;
      std::function<void(bool)>::
      function<cmServerProtocol1::ProcessSetGlobalSettings(cmServerRequest_const&)::__2,void>
                ((function<void(bool)> *)&local_220,&local_228);
      setBool((cmServerRequest *)pbVar1,&kTRACE_EXPAND_KEY_abi_cxx11_,&local_220);
      std::function<void_(bool)>::~function(&local_220);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_250.cm = local_1b0;
      std::function<void(bool)>::
      function<cmServerProtocol1::ProcessSetGlobalSettings(cmServerRequest_const&)::__3,void>
                ((function<void(bool)> *)&local_248,&local_250);
      setBool((cmServerRequest *)pbVar1,&kWARN_UNINITIALIZED_KEY_abi_cxx11_,&local_248);
      std::function<void_(bool)>::~function(&local_248);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_278.cm = local_1b0;
      std::function<void(bool)>::
      function<cmServerProtocol1::ProcessSetGlobalSettings(cmServerRequest_const&)::__4,void>
                ((function<void(bool)> *)&local_270,&local_278);
      setBool((cmServerRequest *)pbVar1,&kWARN_UNUSED_KEY_abi_cxx11_,&local_270);
      std::function<void_(bool)>::~function(&local_270);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2a0.cm = local_1b0;
      std::function<void(bool)>::
      function<cmServerProtocol1::ProcessSetGlobalSettings(cmServerRequest_const&)::__5,void>
                ((function<void(bool)> *)&local_298,&local_2a0);
      setBool((cmServerRequest *)pbVar1,&kWARN_UNUSED_CLI_KEY_abi_cxx11_,&local_298);
      std::function<void_(bool)>::~function(&local_298);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2c8.cm = local_1b0;
      std::function<void(bool)>::
      function<cmServerProtocol1::ProcessSetGlobalSettings(cmServerRequest_const&)::__6,void>
                ((function<void(bool)> *)&local_2c0,&local_2c8);
      setBool((cmServerRequest *)pbVar1,&kCHECK_SYSTEM_VARS_KEY_abi_cxx11_,&local_2c0);
      std::function<void_(bool)>::~function(&local_2c0);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      Json::Value::Value(&local_2f0,nullValue);
      cmServerRequest::Reply(__return_storage_ptr__,(cmServerRequest *)pbVar1,&local_2f0);
      Json::Value::~Value(&local_2f0);
LAB_0015a50d:
      cm._4_4_ = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
      return __return_storage_ptr__;
    }
    local_160 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    pVVar3 = Json::Value::operator[]
                       ((Value *)(boolValues.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),local_160)
    ;
    bVar2 = Json::Value::isNull(pVVar3);
    if (!bVar2) {
      pVVar3 = Json::Value::operator[]
                         ((Value *)(boolValues.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                          local_160);
      bVar2 = Json::Value::isBool(pVVar3);
      pbVar1 = boolValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (!bVar2) {
        std::operator+(&local_1a0,"\"",local_160);
        std::operator+(&local_180,&local_1a0,"\" must be unset or a bool value.");
        cmServerRequest::ReportError(__return_storage_ptr__,(cmServerRequest *)pbVar1,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        goto LAB_0015a50d;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessSetGlobalSettings(
  const cmServerRequest& request)
{
  const std::vector<std::string> boolValues = {
    kDEBUG_OUTPUT_KEY,       kTRACE_KEY,       kTRACE_EXPAND_KEY,
    kWARN_UNINITIALIZED_KEY, kWARN_UNUSED_KEY, kWARN_UNUSED_CLI_KEY,
    kCHECK_SYSTEM_VARS_KEY
  };
  for (std::string const& i : boolValues) {
    if (!request.Data[i].isNull() && !request.Data[i].isBool()) {
      return request.ReportError("\"" + i +
                                 "\" must be unset or a bool value.");
    }
  }

  cmake* cm = this->CMakeInstance();

  setBool(request, kDEBUG_OUTPUT_KEY,
          [cm](bool e) { cm->SetDebugOutputOn(e); });
  setBool(request, kTRACE_KEY, [cm](bool e) { cm->SetTrace(e); });
  setBool(request, kTRACE_EXPAND_KEY, [cm](bool e) { cm->SetTraceExpand(e); });
  setBool(request, kWARN_UNINITIALIZED_KEY,
          [cm](bool e) { cm->SetWarnUninitialized(e); });
  setBool(request, kWARN_UNUSED_KEY, [cm](bool e) { cm->SetWarnUnused(e); });
  setBool(request, kWARN_UNUSED_CLI_KEY,
          [cm](bool e) { cm->SetWarnUnusedCli(e); });
  setBool(request, kCHECK_SYSTEM_VARS_KEY,
          [cm](bool e) { cm->SetCheckSystemVars(e); });

  return request.Reply(Json::Value());
}